

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O1

void __thiscall OpenMD::MoleculeStamp::checkTorsions(MoleculeStamp *this)

{
  _Base_ptr p_Var1;
  _Tuple_impl<2UL,_int,_int> _Var2;
  int iVar3;
  _Head_base<3UL,_int,_false> _Var4;
  _Head_base<2UL,_int,_false> _Var5;
  pointer piVar6;
  long lVar7;
  pointer ppAVar8;
  AtomStamp *pAVar9;
  pointer pcVar10;
  _Tuple_impl<2UL,_int,_int> _Var11;
  bool bVar12;
  _Head_base<3UL,_int,_false> _Var13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var14;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var15;
  _Alloc_hider _Var16;
  pointer ppTVar17;
  iterator iVar18;
  pointer ppBVar19;
  TorsionStamp *this_00;
  _Base_ptr p_Var20;
  ostream *poVar21;
  OpenMDException *pOVar22;
  int __tmp;
  vector<int,_std::allocator<int>_> *cont;
  vector<int,_std::allocator<int>_> *cont_00;
  vector<int,_std::allocator<int>_> *cont_01;
  vector<int,_std::allocator<int>_> *cont_02;
  long lVar23;
  ulong uVar24;
  _Rb_tree_color _Var25;
  int ghostIndex;
  set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
  allTorsions;
  vector<int,_std::allocator<int>_> torsionAtoms;
  vector<int,_std::allocator<int>_> rigidSet;
  ostringstream oss;
  undefined1 local_260 [8];
  _Head_base<1UL,_int,_false> local_258;
  _Head_base<0UL,_int,_false> _Stack_254;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  undefined1 local_240 [32];
  _Base_ptr local_220;
  size_t local_218;
  string local_210;
  vector<int,_std::allocator<int>_> local_1f0;
  undefined1 local_1d8 [12];
  _Head_base<2UL,_int,_false> _Stack_1cc;
  ulong local_1c8;
  AtomStamp *local_1c0;
  _Base_ptr local_1b8;
  _Base_ptr local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  ppTVar17 = (this->torsionStamps_).
             super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((this->torsionStamps_).
      super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar17) {
    lVar23 = 0;
    uVar24 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_210,
                 (vector<int,_std::allocator<int>_> *)
                 (*(long *)((long)ppTVar17 + (lVar23 >> 0x1d)) + 0x98));
      local_240._8_8_ =
           ((long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
      _Var14 = std::
               __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>>
                         (local_210._M_dataplus._M_p,local_210._M_string_length,local_240);
      local_240._0_8_ = (pointer)0x0;
      _Var15 = std::
               __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>>
                         (local_210._M_dataplus._M_p,local_210._M_string_length,local_240);
      if ((_Var14._M_current != (int *)local_210._M_string_length) ||
         (_Var15._M_current != (int *)local_210._M_string_length)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Molecule ",0x12);
        pcVar10 = (this->Name).data_._M_dataplus._M_p;
        local_240._0_8_ = local_240 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_240,pcVar10,pcVar10 + (this->Name).data_._M_string_length);
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_240._0_8_,local_240._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar21,": atoms of torsion",0x12);
        containerToString<std::vector<int,std::allocator<int>>>
                  ((string *)local_260,(OpenMD *)&local_210,cont_00);
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar21,(char *)local_260,
                             CONCAT44(_Stack_254._M_head_impl,local_258._M_head_impl));
        std::__ostream_insert<char,std::char_traits<char>>(poVar21," have invalid indices\n",0x16);
        if (local_260 != (undefined1  [8])&local_250) {
          operator_delete((void *)local_260,local_250._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
          operator_delete((void *)local_240._0_8_,(ulong)(local_240._16_8_ + 1));
        }
        pOVar22 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar22,(string *)local_240);
        __cxa_throw(pOVar22,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      bVar12 = hasDuplicateElement<std::vector<int,std::allocator<int>>>
                         ((vector<int,_std::allocator<int>_> *)&local_210);
      if (bVar12) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Molecule ",0x12);
        pcVar10 = (this->Name).data_._M_dataplus._M_p;
        local_240._0_8_ = local_240 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_240,pcVar10,pcVar10 + (this->Name).data_._M_string_length);
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_240._0_8_,local_240._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar21," : atoms of torsion",0x13);
        containerToString<std::vector<int,std::allocator<int>>>
                  ((string *)local_260,(OpenMD *)&local_210,cont_01);
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar21,(char *)local_260,
                             CONCAT44(_Stack_254._M_head_impl,local_258._M_head_impl));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar21," have duplicated indices\n",0x19);
        if (local_260 != (undefined1  [8])&local_250) {
          operator_delete((void *)local_260,local_250._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
          operator_delete((void *)local_240._0_8_,(ulong)(local_240._16_8_ + 1));
        }
        pOVar22 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar22,(string *)local_240);
        __cxa_throw(pOVar22,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      if ((int *)local_210._M_dataplus._M_p != (int *)0x0) {
        operator_delete(local_210._M_dataplus._M_p,
                        local_210.field_2._M_allocated_capacity - (long)local_210._M_dataplus._M_p);
      }
      uVar24 = uVar24 + 1;
      ppTVar17 = (this->torsionStamps_).
                 super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      lVar23 = lVar23 + 0x100000000;
    } while (uVar24 < (ulong)((long)(this->torsionStamps_).
                                    super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar17 >> 3
                             ));
  }
  ppTVar17 = (this->torsionStamps_).
             super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((this->torsionStamps_).
      super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar17) {
    uVar24 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_210,&ppTVar17[(int)uVar24]->members_);
      local_240._0_8_ = local_240._0_8_ & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_1f0,
                 (long)(this->rigidBodyStamps_).
                       super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->rigidBodyStamps_).
                       super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3,
                 (value_type_conflict1 *)local_240,(allocator_type *)local_260);
      if (local_210._M_dataplus._M_p != (pointer)local_210._M_string_length) {
        piVar6 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        _Var16._M_p = local_210._M_dataplus._M_p;
        do {
          lVar23 = (long)piVar6[*(int *)_Var16._M_p];
          if ((-1 < lVar23) &&
             (iVar3 = ((_Tuple_impl<3UL,_int> *)
                      local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start)[lVar23].super__Head_base<3UL,_int,_false>.
                      _M_head_impl,
             ((_Tuple_impl<3UL,_int> *)
             local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start)[lVar23].super__Head_base<3UL,_int,_false>._M_head_impl = iVar3 + 1,
             2 < iVar3)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Error in Molecule ",0x12);
            pcVar10 = (this->Name).data_._M_dataplus._M_p;
            local_240._0_8_ = local_240 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_240,pcVar10,pcVar10 + (this->Name).data_._M_string_length);
            poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(char *)local_240._0_8_,local_240._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar21,": torsion",9);
            containerToString<std::vector<int,std::allocator<int>>>
                      ((string *)local_260,(OpenMD *)&local_210,cont);
            poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar21,(char *)local_260,
                                 CONCAT44(_Stack_254._M_head_impl,local_258._M_head_impl));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar21,"has four atoms on the same rigid body\n",0x26);
            if (local_260 != (undefined1  [8])&local_250) {
              operator_delete((void *)local_260,local_250._M_allocated_capacity + 1);
            }
            if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
              operator_delete((void *)local_240._0_8_,(ulong)(local_240._16_8_ + 1));
            }
            pOVar22 = (OpenMDException *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            OpenMDException::OpenMDException(pOVar22,(string *)local_240);
            __cxa_throw(pOVar22,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
          }
          _Var16._M_p = _Var16._M_p + 4;
        } while (_Var16._M_p != (pointer)local_210._M_string_length);
      }
      if ((_Tuple_impl<2UL,_int,_int> *)
          local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (_Tuple_impl<2UL,_int,_int> *)0x0) {
        operator_delete(local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((int *)local_210._M_dataplus._M_p != (int *)0x0) {
        operator_delete(local_210._M_dataplus._M_p,
                        local_210.field_2._M_allocated_capacity - (long)local_210._M_dataplus._M_p);
      }
      uVar24 = uVar24 + 1;
      ppTVar17 = (this->torsionStamps_).
                 super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar24 < (ulong)((long)(this->torsionStamps_).
                                    super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar17 >> 3
                             ));
  }
  local_240._24_8_ = local_240 + 8;
  local_240._8_8_ = local_240._8_8_ & 0xffffffff00000000;
  local_240._16_8_ = (_Base_ptr)0x0;
  local_218 = 0;
  ppTVar17 = (this->torsionStamps_).
             super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_220 = (_Base_ptr)local_240._24_8_;
  if ((this->torsionStamps_).
      super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar17) {
    lVar23 = 0;
    uVar24 = 0;
    do {
      lVar7 = *(long *)((long)ppTVar17 + (lVar23 >> 0x1d));
      std::vector<int,_std::allocator<int>_>::vector
                (&local_1f0,(vector<int,_std::allocator<int>_> *)(lVar7 + 0x98));
      if ((long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start == 0xc) {
        local_260._0_4_ = ((_Head_base<3UL,_int,_false> *)(lVar7 + 0x94))->_M_head_impl;
        _Var14 = std::
                 __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           (local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish,local_260);
        if (_Var14._M_current !=
            local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          std::vector<int,_std::allocator<int>_>::insert
                    (&local_1f0,(const_iterator)_Var14._M_current,(value_type_conflict1 *)local_260)
          ;
        }
      }
      _Var2 = *(_Tuple_impl<2UL,_int,_int> *)
               ((long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 8);
      local_1d8._4_4_ =
           (int)_Var2.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
      local_1d8._0_4_ =
           (_Head_base<3UL,_int,_false>)
           (_Head_base<3UL,_int,_false>)
           _Var2.super__Head_base<2UL,_int,_false>._M_head_impl._M_head_impl;
      _Stack_1cc._M_head_impl =
           (((_Tuple_impl<3UL,_int> *)
            local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start)->super__Head_base<3UL,_int,_false>)._M_head_impl;
      _Var11.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
           (_Head_base<3UL,_int,_false>)
           local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[0];
      _Var11.super__Head_base<2UL,_int,_false>._M_head_impl =
           local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[1];
      local_1d8._8_4_ =
           ((_Head_base<2UL,_int,_false> *)
           ((long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + 4))->_M_head_impl;
      if (_Var2.super__Head_base<2UL,_int,_false>._M_head_impl._M_head_impl <
          _Stack_1cc._M_head_impl) {
        local_1d8._0_8_ = _Var11;
        unique0x10001295 = _Var2;
      }
      iVar18 = std::
               _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
               ::find((_Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                       *)local_240,(key_type *)local_1d8);
      if (iVar18._M_node != (_Base_ptr)(local_240 + 8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Molecule ",0x12);
        pcVar10 = (this->Name).data_._M_dataplus._M_p;
        local_260 = (undefined1  [8])&local_250;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_260,pcVar10,pcVar10 + (this->Name).data_._M_string_length);
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_260,
                             CONCAT44(_Stack_254._M_head_impl,local_258._M_head_impl));
        std::__ostream_insert<char,std::char_traits<char>>(poVar21,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar21,"Torsion",7);
        containerToString<std::vector<int,std::allocator<int>>>
                  (&local_210,(OpenMD *)&local_1f0,cont_02);
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar21,local_210._M_dataplus._M_p,local_210._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar21," appears multiple times\n",0x18)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if (local_260 != (undefined1  [8])&local_250) {
          operator_delete((void *)local_260,local_250._M_allocated_capacity + 1);
        }
        pOVar22 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar22,(string *)local_260);
        __cxa_throw(pOVar22,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      std::
      _Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
      ::_M_insert_unique<std::tuple<int,int,int,int>const&>
                ((_Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
                  *)local_240,(key_type *)local_1d8);
      if ((_Tuple_impl<2UL,_int,_int> *)
          local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (_Tuple_impl<2UL,_int,_int> *)0x0) {
        operator_delete(local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar24 = uVar24 + 1;
      ppTVar17 = (this->torsionStamps_).
                 super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      lVar23 = lVar23 + 0x100000000;
    } while (uVar24 < (ulong)((long)(this->torsionStamps_).
                                    super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar17 >> 3
                             ));
  }
  ppBVar19 = (this->bondStamps_).
             super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->bondStamps_).
      super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar19) {
    uVar24 = 0;
    do {
      _Var4._M_head_impl = ppBVar19[(int)uVar24]->a;
      ppAVar8 = (this->atomStamps_).
                super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pAVar9 = ppAVar8[_Var4._M_head_impl];
      p_Var20 = *(_Base_ptr *)((long)&(pAVar9->bondedAtoms_)._M_t._M_impl + 0x18);
      local_1b8 = (_Base_ptr)((long)&(pAVar9->bondedAtoms_)._M_t._M_impl + 8);
      if (p_Var20 == local_1b8) {
        _Var25 = ~_S_red;
      }
      else {
        _Var25 = p_Var20[1]._M_color;
      }
      local_1c8 = uVar24;
      if (_Var25 != ~_S_red) {
        _Var5._M_head_impl = ppBVar19[(int)uVar24]->b;
        local_1c0 = ppAVar8[_Var5._M_head_impl];
        p_Var1 = (_Base_ptr)((long)&(local_1c0->bondedAtoms_)._M_t._M_impl + 8);
        do {
          local_1b0 = p_Var20;
          if (_Var25 != _Var5._M_head_impl) {
            p_Var20 = *(_Base_ptr *)((long)&(local_1c0->bondedAtoms_)._M_t._M_impl + 0x18);
            if (p_Var20 != p_Var1) goto LAB_001ee0f5;
            do {
              _Var13._M_head_impl = ~_S_red;
              while( true ) {
                if (_Var13._M_head_impl == -1) goto LAB_001ee0fe;
                if (_Var13._M_head_impl != _Var4._M_head_impl) {
                  local_260._4_4_ = _Var5._M_head_impl;
                  local_260._0_4_ = _Var13._M_head_impl;
                  local_258._M_head_impl = _Var4._M_head_impl;
                  _Stack_254._M_head_impl = _Var25;
                  iVar18 = std::
                           _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                           ::find((_Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                                   *)local_240,(key_type *)local_260);
                  if (iVar18._M_node == (_Base_ptr)(local_240 + 8)) {
                    std::
                    _Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
                    ::_M_insert_unique<std::tuple<int,int,int,int>const&>
                              ((_Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
                                *)local_240,(tuple<int,_int,_int,_int> *)local_260);
                    this_00 = (TorsionStamp *)operator_new(0xf0);
                    TorsionStamp::TorsionStamp(this_00);
                    TorsionStamp::setMembers(this_00,(tuple<int,_int,_int,_int> *)local_260);
                    addTorsionStamp(this,this_00);
                  }
                }
                p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20);
                if (p_Var20 == p_Var1) break;
LAB_001ee0f5:
                _Var13._M_head_impl = p_Var20[1]._M_color;
              }
            } while( true );
          }
LAB_001ee0fe:
          p_Var20 = (_Base_ptr)std::_Rb_tree_increment(local_1b0);
          if (p_Var20 == local_1b8) {
            _Var25 = ~_S_red;
          }
          else {
            _Var25 = p_Var20[1]._M_color;
          }
        } while (_Var25 != ~_S_red);
      }
      uVar24 = local_1c8 + 1;
      ppBVar19 = (this->bondStamps_).
                 super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar24 < (ulong)((long)(this->bondStamps_).
                                    super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar19 >> 3
                             ));
  }
  std::
  _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
               *)local_240);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void MoleculeStamp::checkTorsions() {
    std::ostringstream oss;
    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp    = getTorsionStamp(i);
      std::vector<int> torsionAtoms = torsionStamp->getMembers();
      std::vector<int>::iterator j =
          std::find_if(torsionAtoms.begin(), torsionAtoms.end(),
                       std::bind(std::greater<int>(), std::placeholders::_1,
                                 getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(torsionAtoms.begin(), torsionAtoms.end(),
                       std::bind(std::less<int>(), std::placeholders::_1, 0));

      if (j != torsionAtoms.end() || k != torsionAtoms.end()) {
        oss << "Error in Molecule " << getName() << ": atoms of torsion"
            << containerToString(torsionAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }
      if (hasDuplicateElement(torsionAtoms)) {
        oss << "Error in Molecule " << getName() << " : atoms of torsion"
            << containerToString(torsionAtoms) << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp    = getTorsionStamp(i);
      std::vector<int> torsionAtoms = torsionStamp->getMembers();
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = torsionAtoms.begin(); j != torsionAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 3) {
            oss << "Error in Molecule " << getName() << ": torsion"
                << containerToString(torsionAtoms)
                << "has four atoms on the same rigid body\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int, int>> allTorsions;
    std::set<std::tuple<int, int, int, int>>::iterator iter;

    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp = getTorsionStamp(i);
      std::vector<int> torsion   = torsionStamp->getMembers();
      if (torsion.size() == 3) {
        int ghostIndex = torsionStamp->getGhostVectorSource();
        std::vector<int>::iterator j =
            std::find(torsion.begin(), torsion.end(), ghostIndex);
        if (j != torsion.end()) { torsion.insert(j, ghostIndex); }
      }

      std::tuple<int, int, int, int> torsionTuple {torsion[0], torsion[1],
                                                   torsion[2], torsion[3]};
      auto& [first, second, third, fourth] = torsionTuple;

      if (first > fourth) {
        std::swap(first, fourth);
        std::swap(second, third);
      }

      iter = allTorsions.find(torsionTuple);
      if (iter == allTorsions.end()) {
        allTorsions.insert(torsionTuple);
      } else {
        oss << "Error in Molecule " << getName() << ": "
            << "Torsion" << containerToString(torsion)
            << " appears multiple times\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNBonds(); ++i) {
      BondStamp* bondStamp = getBondStamp(i);
      int b                = bondStamp->getA();
      int c                = bondStamp->getB();

      AtomStamp* atomB = getAtomStamp(b);
      AtomStamp* atomC = getAtomStamp(c);

      AtomStamp::AtomIter ai2;
      AtomStamp::AtomIter ai3;

      for (int a = atomB->getFirstBondedAtom(ai2); a != -1;
           a     = atomB->getNextBondedAtom(ai2)) {
        if (a == c) continue;

        for (int d = atomC->getFirstBondedAtom(ai3); d != -1;
             d     = atomC->getNextBondedAtom(ai3)) {
          if (d == b) continue;

          std::tuple<int, int, int, int> newTorsion {a, b, c, d};
          auto [first, second, third, fourth] = newTorsion;

          // make sure the first element is always less than or equal
          // to the fourth element in IntTuple4
          if (first > fourth) {
            std::swap(first, fourth);
            std::swap(second, third);
          }

          if (allTorsions.find(newTorsion) == allTorsions.end()) {
            allTorsions.insert(newTorsion);
            TorsionStamp* newTorsionStamp = new TorsionStamp();
            newTorsionStamp->setMembers(newTorsion);
            addTorsionStamp(newTorsionStamp);
          }
        }
      }
    }
  }